

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

void ResetSegmentHeader(VP8Encoder *enc)

{
  VP8EncSegmentHeader *hdr;
  VP8Encoder *enc_local;
  
  (enc->segment_hdr_).num_segments_ = enc->config_->segments;
  (enc->segment_hdr_).update_map_ = (uint)(1 < (enc->segment_hdr_).num_segments_);
  (enc->segment_hdr_).size_ = 0;
  return;
}

Assistant:

static void ResetSegmentHeader(VP8SegmentHeader* const hdr) {
  assert(hdr != NULL);
  hdr->use_segment_ = 0;
  hdr->update_map_ = 0;
  hdr->absolute_delta_ = 1;
  memset(hdr->quantizer_, 0, sizeof(hdr->quantizer_));
  memset(hdr->filter_strength_, 0, sizeof(hdr->filter_strength_));
}